

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hpdf_image_png.c
# Opt level: O3

HPDF_STATUS CreatePallet(HPDF_Dict image,png_structp png_ptr,png_infop info_ptr)

{
  int iVar1;
  HPDF_BYTE *value;
  HPDF_Array array;
  HPDF_Binary obj;
  HPDF_STATUS HVar2;
  HPDF_INT num_pl;
  png_color *src_pl;
  undefined8 local_20;
  
  local_20 = 0;
  iVar1 = png_get_PLTE(png_ptr,info_ptr,&local_20);
  if (iVar1 == 8) {
    value = (HPDF_BYTE *)HPDF_GetMem(image->mmgr,0);
    if (value != (HPDF_BYTE *)0x0) {
      array = HPDF_Array_New(image->mmgr);
      if (array != (HPDF_Array)0x0) {
        HPDF_Dict_Add(image,"ColorSpace",array);
        HPDF_Array_AddName(array,"Indexed");
        HPDF_Array_AddName(array,"DeviceRGB");
        HPDF_Array_AddNumber(array,-1);
        obj = HPDF_Binary_New(image->mmgr,value,0);
        if (obj != (HPDF_Binary)0x0) {
          HPDF_Array_Add(array,obj);
        }
      }
      HPDF_FreeMem(image->mmgr,value);
    }
    HVar2 = image->error->error_no;
  }
  else {
    HVar2 = HPDF_SetError(image->error,0x1043,0x1005);
  }
  return HVar2;
}

Assistant:

static HPDF_STATUS
CreatePallet (HPDF_Dict    image,
              png_structp  png_ptr,
              png_infop    info_ptr)
{
    HPDF_INT num_pl = 0;
    png_color *src_pl = NULL;
    HPDF_BYTE *ppallet;
    HPDF_BYTE *p;
    HPDF_INT i;
    HPDF_Array array;

    /* png_get_PLTE does not call PngErrorFunc even if it failed.
     * so we call HPDF_Set_Error to set error-code.
     */
    if (png_get_PLTE(png_ptr, info_ptr, (png_color**)&src_pl, &num_pl) !=
            PNG_INFO_PLTE)
        return HPDF_SetError (image->error, HPDF_LIBPNG_ERROR,
                    HPDF_CANNOT_GET_PALLET);


    /* make a pallet array for indexed image. */
    ppallet = HPDF_GetMem (image->mmgr, num_pl * 3);
    if (!ppallet)
        return image->error->error_no;

    p = ppallet;
    for (i = 0; i < num_pl; i++, src_pl++) {
        *p++ = src_pl->red;
        *p++ = src_pl->green;
        *p++ = src_pl->blue;
    }

    array = HPDF_Array_New (image->mmgr);
    if (array) {
        HPDF_Binary b;

        HPDF_Dict_Add (image, "ColorSpace", array);

        HPDF_Array_AddName (array, "Indexed");
        HPDF_Array_AddName (array, "DeviceRGB");
        HPDF_Array_AddNumber (array, num_pl - 1);

        b = HPDF_Binary_New (image->mmgr, ppallet, num_pl * 3);
        if (b)
            HPDF_Array_Add (array, b);
    }

    HPDF_FreeMem (image->mmgr, ppallet);

    return image->error->error_no;
}